

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O2

mraa_boolean_t mraa_file_contains_both(char *filename,char *content,char *content2)

{
  FILE *__stream;
  __ssize_t _Var1;
  char *pcVar2;
  char *pcVar3;
  mraa_boolean_t mVar4;
  char *line;
  char *local_40;
  size_t len;
  
  mVar4 = 0;
  if (content != (char *)0x0 && filename != (char *)0x0) {
    local_40 = mraa_file_unglob(filename);
    if (local_40 != (char *)0x0) {
      len = 0;
      line = (char *)0x0;
      __stream = fopen(local_40,"r");
      if (__stream == (FILE *)0x0) {
        free(local_40);
        mVar4 = 0;
      }
      else {
        do {
          do {
            _Var1 = getline(&line,&len,__stream);
            pcVar3 = line;
            if (_Var1 == -1) {
              mVar4 = 0;
              goto LAB_00109069;
            }
            pcVar2 = strstr(line,content);
          } while (pcVar2 == (char *)0x0);
          pcVar3 = strstr(pcVar3,content2);
        } while (pcVar3 == (char *)0x0);
        mVar4 = 1;
LAB_00109069:
        fclose(__stream);
        free(local_40);
        free(line);
      }
    }
  }
  return mVar4;
}

Assistant:

mraa_boolean_t
mraa_file_contains_both(const char* filename, const char* content, const char* content2)
{
    mraa_boolean_t found = 0;
    if ((filename == NULL) || (content == NULL)) {
        return 0;
    }

    char* file = mraa_file_unglob(filename);
    if (file != NULL) {
        size_t len = 0;
        char* line = NULL;
        FILE* fh = fopen(file, "r");
        if (fh == NULL) {
            free(file);
            return 0;
        }
        while ((getline(&line, &len, fh) != -1) && (found == 0)) {
            if (strstr(line, content) && strstr(line, content2)) {
                found = 1;
                break;
            }
        }
        fclose(fh);
        free(file);
        free(line);
    }
    return found;
}